

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall ObjectTest_basic_set_Test::TestBody(ObjectTest_basic_set_Test *this)

{
  longdouble lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  *paVar3;
  long *plVar4;
  undefined1 *puVar5;
  double dVar6;
  Message MVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined2 uVar11;
  undefined4 uVar12;
  undefined2 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  char *pcVar16;
  pointer *__ptr_12;
  pointer *__ptr;
  longdouble lVar17;
  float fVar18;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_;
  object obj;
  undefined1 local_e8 [8];
  undefined2 uStack_e0;
  undefined6 uStack_de;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_d8;
  AssertHelper local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [8];
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_a8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_98;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_78;
  char local_48;
  float local_34;
  double local_30;
  
  local_78._0_2_ = 0;
  local_78._2_2_ = 0;
  local_78._4_4_ = 0;
  local_48 = '\0';
  local_e8[0] = (internal)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<1ul,bool&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(bool *)local_e8);
  local_b8[0] = (Message)(local_48 == '\x01');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< bool >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1ee,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  local_b8[0] = (Message)0x0;
  if (local_48 == '\x01') {
    local_b8[0] = SUB21(local_78._0_2_,0);
  }
  local_98._M_dataplus._M_p._0_1_ = 0;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_e8,"obj .get< bool >()","bool {}",(bool *)local_b8,(bool *)&local_98)
  ;
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1ee,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,signed_char&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,local_e8);
  local_b8[0] = (Message)(local_48 == '\x02');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< signed_char_t >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1ef,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  local_b8[0] = (Message)0x0;
  if (local_48 == '\x02') {
    local_b8[0] = SUB21(local_78._0_2_,0);
  }
  local_98._M_dataplus._M_p._0_1_ = 0;
  testing::internal::CmpHelperEQ<signed_char,signed_char>
            ((internal *)local_e8,"obj .get< signed_char_t >()","signed_char_t {}",local_b8,
             (char *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1ef,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,unsigned_char&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,local_e8);
  local_b8[0] = (Message)(local_48 == '\x02');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< unsigned_char_t >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f0,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  local_b8[0] = (Message)0x0;
  if (local_48 == '\x02') {
    local_b8[0] = SUB21(local_78._0_2_,0);
  }
  local_98._M_dataplus._M_p._0_1_ = 0;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)local_e8,"obj .get< unsigned_char_t >()","unsigned_char_t {}",local_b8,
             (uchar *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f0,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,short&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(short *)local_e8);
  local_b8[0] = (Message)(local_48 == '\x02');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< short >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f1,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  uVar13 = local_78._0_2_;
  if (local_48 != '\x02') {
    uVar13 = 0;
  }
  local_b8[0] = SUB21(uVar13,0);
  local_b8[1] = (undefined1)((ushort)uVar13 >> 8);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  testing::internal::CmpHelperEQ<short,short>
            ((internal *)local_e8,"obj .get< short >()","short {}",(short *)local_b8,
             (short *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f1,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,int&>((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                       *)&local_78._M_first,(int *)local_e8);
  local_b8[0] = (Message)(local_48 == '\x02');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< int >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f2,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  uVar14 = 0;
  if (local_48 == '\x02') {
    uVar14 = CONCAT22(local_78._2_2_,local_78._0_2_);
  }
  local_b8[0] = SUB41(uVar14,0);
  local_b8[1] = (undefined1)((uint)uVar14 >> 8);
  local_b8._2_2_ = (undefined2)((uint)uVar14 >> 0x10);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"obj .get< int >()","int {}",(int *)local_b8,(int *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f2,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  local_e8._4_4_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,long&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(long *)local_e8);
  local_b8[0] = (Message)(local_48 == '\x02');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< long >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,499,(char *)CONCAT44(local_e8._4_4_,
                                     CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  if (local_48 == '\x02') {
    uVar15 = CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_));
  }
  else {
    uVar15 = 0;
  }
  local_b8[0] = SUB81(uVar15,0);
  local_b8[1] = (undefined1)((ulong)uVar15 >> 8);
  local_b8._2_2_ = (undefined2)((ulong)uVar15 >> 0x10);
  local_b8._4_4_ = (undefined4)((ulong)uVar15 >> 0x20);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  local_98._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"obj .get< long >()","long {}",(long *)local_b8,(long *)&local_98)
  ;
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,499,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  local_e8._4_4_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,long_long&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(longlong *)local_e8);
  local_b8[0] = (Message)(local_48 == '\x02');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< long_long_t >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,500,(char *)CONCAT44(local_e8._4_4_,
                                     CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  if (local_48 == '\x02') {
    uVar15 = CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_));
  }
  else {
    uVar15 = 0;
  }
  local_b8[0] = SUB81(uVar15,0);
  local_b8[1] = (undefined1)((ulong)uVar15 >> 8);
  local_b8._2_2_ = (undefined2)((ulong)uVar15 >> 0x10);
  local_b8._4_4_ = (undefined4)((ulong)uVar15 >> 0x20);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  local_98._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long_long,long_long>
            ((internal *)local_e8,"obj .get< long_long_t >()","long_long_t {}",(longlong *)local_b8,
             (longlong *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,500,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  local_e8._4_4_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<2ul,long&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(long *)local_e8);
  local_b8[0] = (Message)(local_48 == '\x02');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< intmax_t >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f5,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  if (local_48 == '\x02') {
    uVar15 = CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_));
  }
  else {
    uVar15 = 0;
  }
  local_b8[0] = SUB81(uVar15,0);
  local_b8[1] = (undefined1)((ulong)uVar15 >> 8);
  local_b8._2_2_ = (undefined2)((ulong)uVar15 >> 0x10);
  local_b8._4_4_ = (undefined4)((ulong)uVar15 >> 0x20);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  local_98._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_e8,"obj .get< intmax_t >()","intmax_t {}",(long *)local_b8,
             (long *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f5,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<3ul,float&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(float *)local_e8);
  local_b8[0] = (Message)(local_48 == '\x03');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< float >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f6,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  local_34 = (float)(longdouble)
                    CONCAT28(local_78._8_2_,
                             CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_)));
  fVar18 = local_34;
  if (local_48 != '\x03') {
    fVar18 = 0.0;
  }
  local_b8[0] = SUB41(fVar18,0);
  local_b8[1] = (undefined1)((uint)fVar18 >> 8);
  local_b8._2_2_ = (undefined2)((uint)fVar18 >> 0x10);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_e8,"obj .get< float >()","float {}",(float *)local_b8,
             (float *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f6,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  local_e8._4_4_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<3ul,double&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(double *)local_e8);
  local_b8[0] = (Message)(local_48 == '\x03');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< double >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f7,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  local_30 = (double)(longdouble)
                     CONCAT28(local_78._8_2_,
                              CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_)));
  dVar6 = local_30;
  if (local_48 != '\x03') {
    dVar6 = 0.0;
  }
  local_b8._4_4_ = (undefined4)((ulong)dVar6 >> 0x20);
  local_b8[0] = SUB81(dVar6,0);
  local_b8[1] = (undefined1)((ulong)dVar6 >> 8);
  local_b8._2_2_ = (undefined2)((ulong)dVar6 >> 0x10);
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  local_98._M_dataplus._M_p._4_4_ = 0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_e8,"obj .get< double >()","double {}",(double *)local_b8,
             (double *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f7,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  lVar1 = (longdouble)0;
  local_e8[0] = SUB101(lVar1,0);
  local_e8[1] = (undefined1)((unkuint10)lVar1 >> 8);
  local_e8._2_2_ = (undefined2)((unkuint10)lVar1 >> 0x10);
  local_e8._4_4_ = (undefined4)((unkuint10)lVar1 >> 0x20);
  uStack_e0 = (undefined2)((unkuint10)lVar1 >> 0x40);
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<3ul,long_double&>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(longdouble *)local_e8);
  local_b8[0] = (Message)(local_48 == '\x03');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< long_double_t >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f8,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  lVar1 = (longdouble)0;
  lVar17 = lVar1;
  if (local_48 == '\x03') {
    lVar17 = (longdouble)
             CONCAT28(local_78._8_2_,
                      CONCAT44(local_78._4_4_,CONCAT22(local_78._2_2_,local_78._0_2_)));
  }
  local_b8[0] = SUB101(lVar17,0);
  local_b8[1] = (undefined1)((unkuint10)lVar17 >> 8);
  local_b8._2_2_ = (undefined2)((unkuint10)lVar17 >> 0x10);
  local_b8._4_4_ = (undefined4)((unkuint10)lVar17 >> 0x20);
  uStack_b0 = (undefined2)((unkuint10)lVar17 >> 0x40);
  local_98._M_dataplus._M_p._0_1_ = SUB101(lVar1,0);
  local_98._M_dataplus._M_p._1_1_ = (undefined1)((unkuint10)lVar1 >> 8);
  local_98._M_dataplus._M_p._2_2_ = (undefined2)((unkuint10)lVar1 >> 0x10);
  local_98._M_dataplus._M_p._4_4_ = (undefined4)((unkuint10)lVar1 >> 0x20);
  local_98._M_string_length._0_2_ = (undefined2)((unkuint10)lVar1 >> 0x40);
  testing::internal::CmpHelperEQ<long_double,long_double>
            ((internal *)local_e8,"obj .get< long_double_t >()","long_double_t {}",
             (longdouble *)local_b8,(longdouble *)&local_98);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)CONCAT62(uStack_de,uStack_e0) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT62(uStack_de,uStack_e0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f8,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    plVar4 = (long *)CONCAT44(local_b8._4_4_,
                              CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_de,uStack_e0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_de,uStack_e0));
  }
  local_e8[0] = SUB81(&local_d8,0);
  local_e8[1] = (undefined1)((ulong)&local_d8 >> 8);
  local_e8._2_2_ = (undefined2)((ulong)&local_d8 >> 0x10);
  local_e8._4_4_ = (undefined4)((ulong)&local_d8 >> 0x20);
  uStack_e0 = 0;
  uStack_de = 0;
  local_d8._M_allocated_capacity = local_d8._M_allocated_capacity & 0xffffffffffffff00;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<4ul,std::__cxx11::u8string>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8)
  ;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
  if (paVar2 != &local_d8) {
    operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
  }
  local_b8[0] = (Message)(local_48 == '\x04');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< std::u8string >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f9,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar2 != &local_d8) {
      operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  local_b8[0] = SUB81(&local_a8,0);
  MVar7 = local_b8[0];
  local_b8[1] = (undefined1)((ulong)&local_a8 >> 8);
  uVar8 = local_b8[1];
  local_b8._2_2_ = (undefined2)((ulong)&local_a8 >> 0x10);
  uVar13 = local_b8._2_2_;
  local_b8._4_4_ = (undefined4)((ulong)&local_a8 >> 0x20);
  uVar14 = local_b8._4_4_;
  uStack_b0 = 0;
  uStack_ae = 0;
  local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             (object *)&local_78._M_first,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_b8)
  ;
  paVar2 = &local_98.field_2;
  local_98._M_dataplus._M_p._0_1_ = SUB81(paVar2,0);
  uVar9 = local_98._M_dataplus._M_p._0_1_;
  local_98._M_dataplus._M_p._1_1_ = (undefined1)((ulong)paVar2 >> 8);
  uVar10 = local_98._M_dataplus._M_p._1_1_;
  local_98._M_dataplus._M_p._2_2_ = (undefined2)((ulong)paVar2 >> 0x10);
  uVar11 = local_98._M_dataplus._M_p._2_2_;
  local_98._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar2 >> 0x20);
  uVar12 = local_98._M_dataplus._M_p._4_4_;
  local_98._M_string_length._0_2_ = 0;
  local_98._M_string_length._2_6_ = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            ((internal *)local_c8,"obj .get< std::u8string >()","std::u8string {}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_98);
  puVar5 = (undefined1 *)
           CONCAT44(local_98._M_dataplus._M_p._4_4_,
                    CONCAT22(local_98._M_dataplus._M_p._2_2_,
                             CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                      local_98._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar5 != paVar2) {
    operator_delete(puVar5,local_98.field_2._M_allocated_capacity + 1);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
  if (paVar3 != &local_d8) {
    operator_delete(paVar3,local_d8._M_allocated_capacity + 1);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_b8._4_4_,CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
  if (paVar3 != &local_a8) {
    operator_delete(paVar3,local_a8._M_allocated_capacity + 1);
  }
  if (local_c8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1f9,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    plVar4 = (long *)CONCAT44(local_e8._4_4_,
                              CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  local_e8[0] = (internal)0x0;
  local_e8[1] = 0;
  local_e8._2_2_ = 0;
  local_e8._4_4_ = 0;
  uStack_e0 = 0;
  uStack_de = 0;
  local_d8._M_allocated_capacity = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<6ul,std::vector<jessilib::object,std::allocator<jessilib::object>>>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  local_b8[0] = (Message)(local_48 == '\x06');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj .has< object::array_type >()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1fa,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar3 != &local_d8) {
      operator_delete(paVar3,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  local_b8[0] = (Message)0x0;
  local_b8[1] = 0;
  local_b8._2_2_ = 0;
  local_b8._4_4_ = 0;
  uStack_b0 = 0;
  uStack_ae = 0;
  local_a8._M_allocated_capacity = 0;
  if (local_48 == '\x06') {
    std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
              ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8,
               (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_78._M_first);
  }
  else {
    local_e8[0] = (internal)0x0;
    local_e8[1] = 0;
    local_e8._2_2_ = 0;
    local_e8._4_4_ = 0;
    uStack_e0 = 0;
    uStack_de = 0;
    local_d8._M_allocated_capacity = 0;
    local_b8[0] = (Message)0x0;
    local_b8[1] = 0;
    local_b8._2_2_ = 0;
    local_b8._4_4_ = 0;
    uStack_b0 = 0;
    uStack_ae = 0;
    local_a8._M_allocated_capacity = 0;
  }
  local_98._M_dataplus._M_p._0_1_ = 0;
  local_98._M_dataplus._M_p._1_1_ = 0;
  local_98._M_dataplus._M_p._2_2_ = 0;
  local_98._M_dataplus._M_p._4_4_ = 0;
  local_98._M_string_length._0_2_ = 0;
  local_98._M_string_length._2_6_ = 0;
  local_98.field_2._M_allocated_capacity = 0;
  testing::internal::
  CmpHelperEQ<std::vector<jessilib::object,std::allocator<jessilib::object>>,std::vector<jessilib::object,std::allocator<jessilib::object>>>
            ((internal *)local_c8,"obj .get< object::array_type >()","object::array_type {}",
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8,
             (vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_98);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)&local_98);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_e8);
  std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector
            ((vector<jessilib::object,_std::allocator<jessilib::object>_> *)local_b8);
  if (local_c8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1fa,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    plVar4 = (long *)CONCAT44(local_e8._4_4_,
                              CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  pcVar16 = "";
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<4ul,char8_t_const(&)[1]>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(char8_t (*) [1])0x494e83);
  local_b8[0] = (Message)(local_48 == '\x04');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1fe,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar3 != &local_d8) {
      operator_delete(paVar3,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  uStack_b0 = 0;
  uStack_ae = 0;
  local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
  local_b8[0] = MVar7;
  local_b8[1] = uVar8;
  local_b8._2_2_ = uVar13;
  local_b8._4_4_ = uVar14;
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             (object *)&local_78._M_first,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_b8)
  ;
  local_98._M_string_length._0_2_ = 0;
  local_98._M_string_length._2_6_ = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_98._M_dataplus._M_p._0_1_ = uVar9;
  local_98._M_dataplus._M_p._1_1_ = uVar10;
  local_98._M_dataplus._M_p._2_2_ = uVar11;
  local_98._M_dataplus._M_p._4_4_ = uVar12;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            ((internal *)local_c8,"obj.get<std::u8string>()","std::u8string{}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_98);
  puVar5 = (undefined1 *)
           CONCAT44(local_98._M_dataplus._M_p._4_4_,
                    CONCAT22(local_98._M_dataplus._M_p._2_2_,
                             CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                      local_98._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar5 != paVar2) {
    operator_delete(puVar5,local_98.field_2._M_allocated_capacity + 1);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
  if (paVar3 != &local_d8) {
    operator_delete(paVar3,local_d8._M_allocated_capacity + 1);
  }
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_b8._4_4_,CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
  if (paVar3 != &local_a8) {
    operator_delete(paVar3,local_a8._M_allocated_capacity + 1);
  }
  if (local_c8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar16 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x1ff,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    plVar4 = (long *)CONCAT44(local_e8._4_4_,
                              CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  pcVar16 = "";
  local_e8[0] = (internal)0x83;
  local_e8[1] = 0x4e;
  local_e8._2_2_ = 0x49;
  local_e8._4_4_ = 0;
  local_b8[0] = (Message)0x83;
  local_b8[1] = 0x4e;
  local_b8._2_2_ = 0x49;
  local_b8._4_4_ = 0;
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::emplace<4ul,char8_t_const*,char8_t_const*>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)&local_78._M_first,(char8_t **)local_e8,(char8_t **)local_b8);
  local_b8[0] = (Message)(local_48 == '\x04');
  uStack_b0 = 0;
  uStack_ae = 0;
  if (!(bool)local_b8[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_e8,local_b8,"obj.has<std::u8string>()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x203,(char *)CONCAT44(local_e8._4_4_,
                                       CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0]))));
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
              *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (paVar3 != &local_d8) {
      operator_delete(paVar3,local_d8._M_allocated_capacity + 1);
    }
    plVar4 = (long *)CONCAT44(local_98._M_dataplus._M_p._4_4_,
                              CONCAT22(local_98._M_dataplus._M_p._2_2_,
                                       CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                                local_98._M_dataplus._M_p._0_1_)));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT62(uStack_ae,uStack_b0) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT62(uStack_ae,uStack_b0));
  }
  uStack_b0 = 0;
  uStack_ae = 0;
  local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
  local_b8[0] = MVar7;
  local_b8[1] = uVar8;
  local_b8._2_2_ = uVar13;
  local_b8._4_4_ = uVar14;
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             (object *)&local_78._M_first,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_b8)
  ;
  local_98._M_string_length._0_2_ = 0;
  local_98._M_string_length._2_6_ = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_98._M_dataplus._M_p._0_1_ = uVar9;
  local_98._M_dataplus._M_p._1_1_ = uVar10;
  local_98._M_dataplus._M_p._2_2_ = uVar11;
  local_98._M_dataplus._M_p._4_4_ = uVar12;
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,std::__cxx11::u8string>
            ((internal *)local_c8,"obj.get<std::u8string>()","std::u8string{}",
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_e8,
             &local_98);
  puVar5 = (undefined1 *)
           CONCAT44(local_98._M_dataplus._M_p._4_4_,
                    CONCAT22(local_98._M_dataplus._M_p._2_2_,
                             CONCAT11(local_98._M_dataplus._M_p._1_1_,
                                      local_98._M_dataplus._M_p._0_1_)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)puVar5 != paVar2) {
    operator_delete(puVar5,local_98.field_2._M_allocated_capacity + 1);
  }
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
  if (paVar2 != &local_d8) {
    operator_delete(paVar2,local_d8._M_allocated_capacity + 1);
  }
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
            *)CONCAT44(local_b8._4_4_,CONCAT22(local_b8._2_2_,CONCAT11(local_b8[1],local_b8[0])));
  if (paVar2 != &local_a8) {
    operator_delete(paVar2,local_a8._M_allocated_capacity + 1);
  }
  if (local_c8[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar16 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x204,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    plVar4 = (long *)CONCAT44(local_e8._4_4_,
                              CONCAT22(local_e8._2_2_,CONCAT11(local_e8[1],local_e8[0])));
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_78._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_set) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, bool);
	OBJECT_BASIC_SET_TEST(obj, signed_char_t);
	OBJECT_BASIC_SET_TEST(obj, unsigned_char_t);
	OBJECT_BASIC_SET_TEST(obj, short);
	OBJECT_BASIC_SET_TEST(obj, int);
	OBJECT_BASIC_SET_TEST(obj, long);
	OBJECT_BASIC_SET_TEST(obj, long_long_t);
	OBJECT_BASIC_SET_TEST(obj, intmax_t);
	OBJECT_BASIC_SET_TEST(obj, float);
	OBJECT_BASIC_SET_TEST(obj, double);
	OBJECT_BASIC_SET_TEST(obj, long_double_t);
	OBJECT_BASIC_SET_TEST(obj, std::u8string);
	OBJECT_BASIC_SET_TEST(obj, object::array_type);

	// const char*
	obj.set(u8"");
	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});

	// std::u8string_view
	obj.set(u8""sv);
	EXPECT_TRUE(obj.has<std::u8string>());
	EXPECT_EQ(obj.get<std::u8string>(), std::u8string{});
}